

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDestinationRecord.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::EntityDestinationRecord::Decode(EntityDestinationRecord *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xb < KVar1) {
    (*(this->m_Entity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_Entity,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16DstCommsDvcID);
    KDataStream::Read(stream,&this->m_ui8DstLineID);
    KDataStream::Read(stream,&this->m_ui8DstPriority);
    KDataStream::Read(stream,&this->m_ui8LnStCmd);
    KDataStream::Read(stream,&this->m_uiPadding1);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void EntityDestinationRecord::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < ENTITY_DESTINATION_RECORD_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> KDIS_STREAM m_Entity
           >> m_ui16DstCommsDvcID
           >> m_ui8DstLineID
           >> m_ui8DstPriority
           >> m_ui8LnStCmd
           >> m_uiPadding1;
}